

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header_magic(p_ply ply)

{
  int iVar1;
  ushort **ppuVar2;
  bool local_21;
  char *magic;
  p_ply ply_local;
  
  iVar1 = BREFILL(ply);
  if (iVar1 == 0) {
    (*ply->error_cb)(ply,"Unable to read magic number from file");
  }
  else {
    if ((((ply->buffer[0] == 'p') && (ply->buffer[1] == 'l')) && (ply->buffer[2] == 'y')) &&
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)ply->buffer[3]] & 0x2000) != 0)) {
      local_21 = false;
      if (ply->buffer[3] == '\r') {
        local_21 = ply->buffer[4] == '\n';
      }
      ply->rn = (uint)local_21;
      ply->buffer_first = ply->buffer_first + 3;
      return 1;
    }
    (*ply->error_cb)(ply,"Wrong magic number. Expected \'ply\'");
  }
  return 0;
}

Assistant:

static int ply_read_header_magic(p_ply ply) {
    char *magic = ply->buffer;
    if (!BREFILL(ply)) {
        ply->error_cb(ply, "Unable to read magic number from file");
        return 0;
    }
    /* check if it is ply */
    if (magic[0] != 'p' || magic[1] != 'l' || magic[2] != 'y'
            || !isspace(magic[3])) {
        ply->error_cb(ply, "Wrong magic number. Expected 'ply'");
        return 0;
    }
    /* figure out if we have to skip the extra character
     * after header when we reach the binary part of file */
    ply->rn = magic[3] == '\r' && magic[4] == '\n';
    BSKIP(ply, 3);
    return 1;
}